

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O1

void BZ2_compressBlock(EState *s,Bool is_last_block)

{
  UChar (*paUVar1) [258];
  short *psVar2;
  UChar UVar3;
  UChar UVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  UInt16 *pUVar60;
  bool bVar61;
  undefined4 *puVar62;
  int iVar63;
  uint uVar64;
  int iVar65;
  int iVar66;
  long lVar67;
  long lVar68;
  UInt32 *pUVar69;
  bool bVar70;
  int iVar71;
  uint uVar72;
  uint uVar73;
  uint uVar74;
  UInt16 *pUVar75;
  size_t sVar76;
  Bool *pBVar77;
  ulong uVar78;
  Int32 (*paIVar79) [258];
  UChar UVar80;
  undefined7 in_register_00000031;
  ulong uVar81;
  ulong uVar82;
  size_t __n;
  UChar *pUVar83;
  UChar (*paUVar84) [258];
  uint uVar85;
  ulong uVar86;
  ulong uVar87;
  ulong uVar88;
  UInt16 cost [6];
  Int32 fave [6];
  ulong local_1e0;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  Int32 (*local_1a0) [258];
  UChar local_198 [24];
  ulong local_180;
  ulong local_178;
  undefined4 local_16c;
  Bool *local_168;
  UInt32 *local_160;
  size_t local_158;
  size_t local_150;
  UChar (*local_148) [258];
  ulong local_140;
  undefined4 local_138;
  
  if (0 < s->nblock) {
    uVar64 = s->blockCRC;
    s->blockCRC = ~uVar64;
    s->combinedCRC = (s->combinedCRC << 1 | (uint)((int)s->combinedCRC < 0)) ^ ~uVar64;
    if (1 < s->blockNo) {
      s->numZ = 0;
    }
    if (1 < s->verbosity) {
      fprintf(_stderr,"    block %d: crc = 0x%08x, combined CRC = 0x%08x, size = %d\n");
    }
    BZ2_blockSort(s);
  }
  s->zbits = (UChar *)((long)s->nblock + (long)s->arr2);
  if (s->blockNo == 1) {
    s->bsBuff = 0;
    s->bsLive = 0;
    bsPutUChar(s,'B');
    bsPutUChar(s,'Z');
    bsPutUChar(s,'h');
    bsPutUChar(s,(char)s->blockSize100k + '0');
  }
  if (s->nblock < 1) goto LAB_0012a061;
  bsPutUChar(s,'1');
  bsPutUChar(s,'A');
  bsPutUChar(s,'Y');
  bsPutUChar(s,'&');
  bsPutUChar(s,'S');
  bsPutUChar(s,'Y');
  bsPutUInt32(s,s->blockCRC);
  iVar63 = s->bsLive;
  if (7 < iVar63) {
    do {
      s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
      s->numZ = s->numZ + 1;
      s->bsBuff = s->bsBuff << 8;
      iVar71 = s->bsLive;
      iVar63 = iVar71 + -8;
      s->bsLive = iVar63;
    } while (0xf < iVar71);
  }
  local_16c = (int)CONCAT71(in_register_00000031,is_last_block);
  iVar63 = iVar63 + 1;
  s->bsLive = iVar63;
  iVar71 = s->origPtr;
  if (7 < iVar63) {
    do {
      s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
      s->numZ = s->numZ + 1;
      s->bsBuff = s->bsBuff << 8;
      iVar66 = s->bsLive;
      iVar63 = iVar66 + -8;
      s->bsLive = iVar63;
    } while (0xf < iVar66);
  }
  s->bsBuff = s->bsBuff | iVar71 << (8U - (char)iVar63 & 0x1f);
  s->bsLive = iVar63 + 0x18;
  pUVar69 = s->ptr;
  pUVar83 = s->block;
  pUVar60 = s->mtfv;
  s->nInUse = 0;
  lVar67 = -0x100;
  do {
    if (s->unseqToSeq[lVar67] != '\0') {
      iVar63 = s->nInUse;
      *(char *)((long)s->mtfFreq + lVar67 + -0x20) = (char)iVar63;
      s->nInUse = iVar63 + 1;
    }
    lVar67 = lVar67 + 1;
  } while (lVar67 != 0);
  iVar63 = s->nInUse;
  lVar67 = (long)iVar63;
  if (-2 < lVar67) {
    memset(s->mtfFreq,0,(ulong)(iVar63 + 2) << 2);
  }
  if (0 < iVar63) {
    lVar68 = 0;
    do {
      *(char *)((long)&local_138 + lVar68) = (char)lVar68;
      lVar68 = lVar68 + 1;
    } while (lVar67 != lVar68);
  }
  uVar82 = (ulong)(uint)s->nblock;
  if (s->nblock < 1) {
    uVar64 = 0;
    iVar71 = 0;
  }
  else {
    lVar68 = 0;
    iVar71 = 0;
    uVar64 = 0;
    do {
      UVar4 = local_138._1_1_;
      UVar80 = s->unseqToSeq
               [pUVar83[(int)(((int)(pUVar69[lVar68] - 1) >> 0x1f & (uint)uVar82) + pUVar69[lVar68]
                             + -1)]];
      if ((UChar)local_138 == UVar80) {
        iVar71 = iVar71 + 1;
      }
      else {
        if (0 < iVar71) {
          uVar72 = iVar71 - 1;
          uVar82 = (ulong)(int)uVar64;
          pUVar75 = pUVar60 + uVar82;
          while( true ) {
            uVar64 = (int)uVar82 + 1;
            uVar82 = (ulong)uVar64;
            if ((uVar72 & 1) == 0) {
              *pUVar75 = 0;
              s->mtfFreq[0] = s->mtfFreq[0] + 1;
            }
            else {
              *pUVar75 = 1;
              s->mtfFreq[1] = s->mtfFreq[1] + 1;
            }
            if ((int)uVar72 < 2) break;
            uVar72 = uVar72 - 2 >> 1;
            pUVar75 = pUVar75 + 1;
          }
          iVar71 = 0;
        }
        local_138._1_1_ = (UChar)local_138;
        puVar62 = &local_138;
        while (UVar80 != UVar4) {
          UVar3 = *(UChar *)((long)puVar62 + 2);
          *(UChar *)((long)puVar62 + 2) = UVar4;
          UVar4 = UVar3;
          puVar62 = (undefined4 *)((long)puVar62 + 1);
        }
        local_138._0_1_ = UVar4;
        iVar66 = ((int)(undefined4 *)((long)puVar62 + 1) - (int)&local_138) + 1;
        pUVar60[(int)uVar64] = (UInt16)iVar66;
        uVar64 = uVar64 + 1;
        s->mtfFreq[iVar66] = s->mtfFreq[iVar66] + 1;
      }
      lVar68 = lVar68 + 1;
      uVar82 = (ulong)s->nblock;
    } while (lVar68 < (long)uVar82);
  }
  if (0 < iVar71) {
    uVar72 = iVar71 - 1;
    uVar82 = (ulong)(int)uVar64;
    pUVar75 = pUVar60 + uVar82;
    while( true ) {
      uVar64 = (int)uVar82 + 1;
      uVar82 = (ulong)uVar64;
      if ((uVar72 & 1) == 0) {
        *pUVar75 = 0;
        s->mtfFreq[0] = s->mtfFreq[0] + 1;
      }
      else {
        *pUVar75 = 1;
        s->mtfFreq[1] = s->mtfFreq[1] + 1;
      }
      if ((int)uVar72 < 2) break;
      uVar72 = uVar72 - 2 >> 1;
      pUVar75 = pUVar75 + 1;
    }
  }
  pUVar60[(int)uVar64] = (short)iVar63 + 1;
  s->mtfFreq[lVar67 + 1] = s->mtfFreq[lVar67 + 1] + 1;
  s->nMTF = uVar64 + 1;
  if (2 < s->verbosity) {
    fprintf(_stderr,"      %d in block, %d after MTF & 1-2 coding, %d+2 syms in use\n",
            (ulong)(uint)s->nblock,(ulong)(uVar64 + 1),(ulong)(uint)s->nInUse);
  }
  iVar63 = s->nInUse;
  uVar64 = iVar63 + 2;
  __n = 1;
  if (1 < (int)uVar64) {
    __n = (size_t)uVar64;
  }
  paUVar1 = s->len;
  lVar67 = 0;
  do {
    if (-2 < iVar63) {
      memset(*paUVar1 + lVar67,0xf,__n);
    }
    lVar67 = lVar67 + 0x102;
  } while (lVar67 != 0x60c);
  if (s->nMTF < 1) {
    BZ2_bz__AssertH__fail(0xbb9);
  }
  iVar71 = s->nMTF;
  uVar82 = 0;
  if (iVar71 < 200) {
    uVar72 = 2;
LAB_00127b31:
    bVar61 = false;
  }
  else {
    if (iVar71 < 600) {
      uVar72 = 3;
      goto LAB_00127b31;
    }
    if (iVar71 < 0x4b0) {
      uVar72 = 4;
      goto LAB_00127b31;
    }
    bVar61 = 0x95f < iVar71;
    uVar72 = bVar61 + 5;
  }
  uVar88 = (ulong)uVar72;
  pUVar83 = s->selectorMtf + (ulong)(uVar72 * 0x102) + 0x4550;
  uVar81 = uVar88;
  local_168 = s->inUse;
  do {
    iVar65 = iVar71 / (int)uVar81;
    iVar66 = (int)uVar82;
    uVar85 = iVar66 - 1;
    uVar87 = (ulong)uVar85;
    uVar78 = 0;
    if ((0 < iVar65) && ((int)uVar85 <= iVar63)) {
      uVar78 = 0;
      uVar86 = (long)(int)uVar85;
      do {
        uVar85 = (int)uVar78 + s->mtfFreq[uVar86 + 1];
        uVar78 = (ulong)uVar85;
        uVar87 = uVar86 + 1;
        if ((long)iVar63 <= (long)uVar86) break;
        uVar86 = uVar87;
      } while ((int)uVar85 < iVar65);
    }
    iVar65 = (int)uVar87;
    if (((iVar66 < iVar65) && (uVar81 != 1 && uVar81 != uVar88)) &&
       ((uVar72 - (int)uVar81 & 0x80000001) == 1)) {
      uVar78 = (ulong)(uint)((int)uVar78 - s->mtfFreq[iVar65]);
      uVar87 = (ulong)(iVar65 - 1);
    }
    if (2 < s->verbosity) {
      fprintf(_stderr,"      initial group %d, [%d .. %d], has %d syms (%4.1f%%)\n",
              ((double)(int)uVar78 * 100.0) / (double)s->nMTF,uVar81 & 0xffffffff,uVar82,
              uVar87 & 0xffffffff,uVar78);
    }
    if (-2 < iVar63) {
      sVar76 = 0;
      do {
        UVar80 = '\0';
        if ((long)(int)uVar87 < (long)sVar76) {
          UVar80 = '\x0f';
        }
        if ((long)sVar76 < (long)iVar66) {
          UVar80 = '\x0f';
        }
        pUVar83[sVar76] = UVar80;
        sVar76 = sVar76 + 1;
      } while (__n != sVar76);
    }
    iVar71 = iVar71 - (int)uVar78;
    pUVar83 = pUVar83 + -0x102;
    uVar82 = (ulong)((int)uVar87 + 1);
    bVar70 = 1 < (long)uVar81;
    uVar81 = uVar81 - 1;
  } while (bVar70);
  local_1a0 = s->rfreq;
  local_150 = (size_t)(uVar72 * 4);
  local_158 = __n * 4;
  local_140 = (ulong)(uVar72 * 2);
  local_178 = (ulong)(uVar72 * 0x408);
  local_160 = s->len_pack[0] + 2;
  local_148 = s->len;
  local_180 = 0;
  do {
    sVar76 = local_158;
    paIVar79 = local_1a0;
    memset(&local_138,0,local_150);
    uVar82 = 0;
    do {
      if (-2 < iVar63) {
        memset((void *)((long)*paIVar79 + uVar82),0,sVar76);
      }
      uVar82 = uVar82 + 0x408;
    } while (local_178 != uVar82);
    if ((bool)(-2 < iVar63 & bVar61)) {
      sVar76 = 0;
      pUVar69 = local_160;
      do {
        (*(UInt32 (*) [4])(pUVar69 + -2))[0] =
             (uint)s->len[0][sVar76] | (uint)s->len[1][sVar76] << 0x10;
        pUVar69[-1] = (uint)s->len[2][sVar76] | (uint)s->len[3][sVar76] << 0x10;
        *pUVar69 = (uint)s->len[4][sVar76] | (uint)s->len[5][sVar76] << 0x10;
        sVar76 = sVar76 + 1;
        pUVar69 = pUVar69 + 4;
      } while (__n != sVar76);
    }
    iVar71 = s->nMTF;
    if (iVar71 < 1) {
      local_1e0 = 0;
    }
    else {
      local_1e0 = 0;
      iVar66 = 0;
      do {
        memset(&local_1ac,0,local_140);
        paUVar84 = local_148;
        paIVar79 = local_1a0;
        iVar65 = iVar71 + -1;
        if (iVar66 + 0x31 < iVar71) {
          iVar65 = iVar66 + 0x31;
        }
        bVar70 = (bool)(iVar65 - iVar66 == 0x31 & bVar61);
        if (bVar70) {
          uVar7 = pUVar60[iVar66];
          uVar8 = pUVar60[(long)iVar66 + 1];
          uVar9 = pUVar60[(long)iVar66 + 2];
          uVar10 = pUVar60[(long)iVar66 + 3];
          uVar11 = pUVar60[(long)iVar66 + 4];
          uVar12 = pUVar60[(long)iVar66 + 5];
          uVar13 = pUVar60[(long)iVar66 + 6];
          uVar14 = pUVar60[(long)iVar66 + 7];
          uVar15 = pUVar60[(long)iVar66 + 8];
          uVar16 = pUVar60[(long)iVar66 + 9];
          uVar17 = pUVar60[(long)iVar66 + 10];
          uVar18 = pUVar60[(long)iVar66 + 0xb];
          uVar19 = pUVar60[(long)iVar66 + 0xc];
          uVar20 = pUVar60[(long)iVar66 + 0xd];
          uVar21 = pUVar60[(long)iVar66 + 0xe];
          uVar22 = pUVar60[(long)iVar66 + 0xf];
          uVar23 = pUVar60[(long)iVar66 + 0x10];
          uVar24 = pUVar60[(long)iVar66 + 0x11];
          uVar25 = pUVar60[(long)iVar66 + 0x12];
          uVar26 = pUVar60[(long)iVar66 + 0x13];
          uVar27 = pUVar60[(long)iVar66 + 0x14];
          uVar28 = pUVar60[(long)iVar66 + 0x15];
          uVar29 = pUVar60[(long)iVar66 + 0x16];
          uVar30 = pUVar60[(long)iVar66 + 0x17];
          uVar31 = pUVar60[(long)iVar66 + 0x18];
          uVar32 = pUVar60[(long)iVar66 + 0x19];
          uVar33 = pUVar60[(long)iVar66 + 0x1a];
          uVar34 = pUVar60[(long)iVar66 + 0x1b];
          uVar35 = pUVar60[(long)iVar66 + 0x1c];
          uVar36 = pUVar60[(long)iVar66 + 0x1d];
          uVar37 = pUVar60[(long)iVar66 + 0x1e];
          uVar38 = pUVar60[(long)iVar66 + 0x1f];
          uVar39 = pUVar60[(long)iVar66 + 0x20];
          uVar40 = pUVar60[(long)iVar66 + 0x21];
          uVar41 = pUVar60[(long)iVar66 + 0x22];
          uVar42 = pUVar60[(long)iVar66 + 0x23];
          uVar43 = pUVar60[(long)iVar66 + 0x24];
          uVar44 = pUVar60[(long)iVar66 + 0x25];
          uVar45 = pUVar60[(long)iVar66 + 0x26];
          uVar46 = pUVar60[(long)iVar66 + 0x27];
          uVar47 = pUVar60[(long)iVar66 + 0x28];
          uVar48 = pUVar60[(long)iVar66 + 0x29];
          uVar49 = pUVar60[(long)iVar66 + 0x2a];
          uVar50 = pUVar60[(long)iVar66 + 0x2b];
          uVar51 = pUVar60[(long)iVar66 + 0x2c];
          uVar52 = pUVar60[(long)iVar66 + 0x2d];
          uVar53 = pUVar60[(long)iVar66 + 0x2e];
          uVar54 = pUVar60[(long)iVar66 + 0x2f];
          uVar55 = pUVar60[(long)iVar66 + 0x30];
          uVar56 = pUVar60[(long)iVar66 + 0x31];
          local_1ac = s->len_pack[uVar8][0] + s->len_pack[uVar7][0] + s->len_pack[uVar9][0] +
                      s->len_pack[uVar10][0] + s->len_pack[uVar11][0] + s->len_pack[uVar12][0] +
                      s->len_pack[uVar13][0] + s->len_pack[uVar14][0] + s->len_pack[uVar15][0] +
                      s->len_pack[uVar16][0] + s->len_pack[uVar17][0] + s->len_pack[uVar18][0] +
                      s->len_pack[uVar19][0] + s->len_pack[uVar20][0] + s->len_pack[uVar21][0] +
                      s->len_pack[uVar22][0] + s->len_pack[uVar23][0] + s->len_pack[uVar24][0] +
                      s->len_pack[uVar25][0] + s->len_pack[uVar26][0] + s->len_pack[uVar27][0] +
                      s->len_pack[uVar28][0] + s->len_pack[uVar29][0] + s->len_pack[uVar30][0] +
                      s->len_pack[uVar31][0] + s->len_pack[uVar32][0] + s->len_pack[uVar33][0] +
                      s->len_pack[uVar34][0] + s->len_pack[uVar35][0] + s->len_pack[uVar36][0] +
                      s->len_pack[uVar37][0] + s->len_pack[uVar38][0] + s->len_pack[uVar39][0] +
                      s->len_pack[uVar40][0] + s->len_pack[uVar41][0] + s->len_pack[uVar42][0] +
                      s->len_pack[uVar43][0] + s->len_pack[uVar44][0] + s->len_pack[uVar45][0] +
                      s->len_pack[uVar46][0] + s->len_pack[uVar47][0] + s->len_pack[uVar48][0] +
                      s->len_pack[uVar49][0] + s->len_pack[uVar50][0] + s->len_pack[uVar51][0] +
                      s->len_pack[uVar52][0] + s->len_pack[uVar53][0] + s->len_pack[uVar54][0] +
                      s->len_pack[uVar55][0] + s->len_pack[uVar56][0];
          local_1a8 = s->len_pack[uVar8][1] + s->len_pack[uVar7][1] + s->len_pack[uVar9][1] +
                      s->len_pack[uVar10][1] + s->len_pack[uVar11][1] + s->len_pack[uVar12][1] +
                      s->len_pack[uVar13][1] + s->len_pack[uVar14][1] + s->len_pack[uVar15][1] +
                      s->len_pack[uVar16][1] + s->len_pack[uVar17][1] + s->len_pack[uVar18][1] +
                      s->len_pack[uVar19][1] + s->len_pack[uVar20][1] + s->len_pack[uVar21][1] +
                      s->len_pack[uVar22][1] + s->len_pack[uVar23][1] + s->len_pack[uVar24][1] +
                      s->len_pack[uVar25][1] + s->len_pack[uVar26][1] + s->len_pack[uVar27][1] +
                      s->len_pack[uVar28][1] + s->len_pack[uVar29][1] + s->len_pack[uVar30][1] +
                      s->len_pack[uVar31][1] + s->len_pack[uVar32][1] + s->len_pack[uVar33][1] +
                      s->len_pack[uVar34][1] + s->len_pack[uVar35][1] + s->len_pack[uVar36][1] +
                      s->len_pack[uVar37][1] + s->len_pack[uVar38][1] + s->len_pack[uVar39][1] +
                      s->len_pack[uVar40][1] + s->len_pack[uVar41][1] + s->len_pack[uVar42][1] +
                      s->len_pack[uVar43][1] + s->len_pack[uVar44][1] + s->len_pack[uVar45][1] +
                      s->len_pack[uVar46][1] + s->len_pack[uVar47][1] + s->len_pack[uVar48][1] +
                      s->len_pack[uVar49][1] + s->len_pack[uVar50][1] + s->len_pack[uVar51][1] +
                      s->len_pack[uVar52][1] + s->len_pack[uVar53][1] + s->len_pack[uVar54][1] +
                      s->len_pack[uVar55][1] + s->len_pack[uVar56][1];
          local_1a4 = s->len_pack[uVar8][2] + s->len_pack[uVar7][2] + s->len_pack[uVar9][2] +
                      s->len_pack[uVar10][2] + s->len_pack[uVar11][2] + s->len_pack[uVar12][2] +
                      s->len_pack[uVar13][2] + s->len_pack[uVar14][2] + s->len_pack[uVar15][2] +
                      s->len_pack[uVar16][2] + s->len_pack[uVar17][2] + s->len_pack[uVar18][2] +
                      s->len_pack[uVar19][2] + s->len_pack[uVar20][2] + s->len_pack[uVar21][2] +
                      s->len_pack[uVar22][2] + s->len_pack[uVar23][2] + s->len_pack[uVar24][2] +
                      s->len_pack[uVar25][2] + s->len_pack[uVar26][2] + s->len_pack[uVar27][2] +
                      s->len_pack[uVar28][2] + s->len_pack[uVar29][2] + s->len_pack[uVar30][2] +
                      s->len_pack[uVar31][2] + s->len_pack[uVar32][2] + s->len_pack[uVar33][2] +
                      s->len_pack[uVar34][2] + s->len_pack[uVar35][2] + s->len_pack[uVar36][2] +
                      s->len_pack[uVar37][2] + s->len_pack[uVar38][2] + s->len_pack[uVar39][2] +
                      s->len_pack[uVar40][2] + s->len_pack[uVar41][2] + s->len_pack[uVar42][2] +
                      s->len_pack[uVar43][2] + s->len_pack[uVar44][2] + s->len_pack[uVar45][2] +
                      s->len_pack[uVar46][2] + s->len_pack[uVar47][2] + s->len_pack[uVar48][2] +
                      s->len_pack[uVar49][2] + s->len_pack[uVar50][2] + s->len_pack[uVar51][2] +
                      s->len_pack[uVar52][2] + s->len_pack[uVar53][2] + s->len_pack[uVar54][2] +
                      s->len_pack[uVar55][2] + s->len_pack[uVar56][2];
        }
        else if (iVar66 <= iVar65) {
          lVar67 = (long)iVar66;
          do {
            pUVar83 = *paUVar84 + pUVar60[lVar67];
            uVar82 = 0;
            do {
              psVar2 = (short *)((long)&local_1ac + uVar82 * 2);
              *psVar2 = *psVar2 + (ushort)*pUVar83;
              uVar82 = uVar82 + 1;
              pUVar83 = pUVar83 + 0x102;
            } while (uVar88 != uVar82);
            lVar67 = lVar67 + 1;
          } while (iVar65 + 1 != (int)lVar67);
        }
        uVar82 = 0xffffffff;
        uVar81 = 0;
        uVar85 = 999999999;
        do {
          uVar7 = *(ushort *)((long)&local_1ac + uVar81 * 2);
          uVar74 = (uint)uVar7;
          if (uVar85 < uVar7) {
            uVar74 = uVar85;
          }
          if (uVar7 < uVar85) {
            uVar82 = uVar81 & 0xffffffff;
          }
          uVar81 = uVar81 + 1;
          uVar85 = uVar74;
        } while (uVar88 != uVar81);
        iVar71 = (int)uVar82;
        (&local_138)[iVar71] = (&local_138)[iVar71] + 1;
        s->selector[local_1e0] = (UChar)uVar82;
        if (bVar70) {
          paIVar79[iVar71][pUVar60[iVar66]] = paIVar79[iVar71][pUVar60[iVar66]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 1]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 1]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 2]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 2]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 3]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 3]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 4]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 4]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 5]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 5]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 6]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 6]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 7]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 7]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 8]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 8]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 9]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 9]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 10]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 10]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0xb]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0xb]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0xc]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0xc]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0xd]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0xd]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0xe]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0xe]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0xf]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0xf]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x10]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x10]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x11]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x11]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x12]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x12]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x13]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x13]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x14]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x14]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x15]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x15]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x16]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x16]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x17]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x17]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x18]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x18]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x19]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x19]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x1a]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x1a]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x1b]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x1b]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x1c]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x1c]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x1d]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x1d]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x1e]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x1e]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x1f]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x1f]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x20]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x20]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x21]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x21]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x22]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x22]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x23]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x23]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x24]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x24]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x25]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x25]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x26]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x26]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x27]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x27]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x28]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x28]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x29]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x29]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x2a]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x2a]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x2b]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x2b]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x2c]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x2c]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x2d]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x2d]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x2e]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x2e]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x2f]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x2f]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x30]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x30]] + 1;
          paIVar79[iVar71][pUVar60[(long)iVar66 + 0x31]] =
               paIVar79[iVar71][pUVar60[(long)iVar66 + 0x31]] + 1;
        }
        else if (iVar66 <= iVar65) {
          lVar67 = 0;
          do {
            paIVar79[iVar71][pUVar60[iVar66 + lVar67]] =
                 paIVar79[iVar71][pUVar60[iVar66 + lVar67]] + 1;
            lVar67 = lVar67 + 1;
          } while ((iVar65 - iVar66) + 1 != (int)lVar67);
        }
        local_1e0 = local_1e0 + 1;
        iVar66 = iVar65 + 1;
        iVar71 = s->nMTF;
      } while (iVar66 < iVar71);
    }
    paIVar79 = local_1a0;
    paUVar84 = paUVar1;
    uVar82 = uVar88;
    if (2 < s->verbosity) {
      BZ2_compressBlock_cold_1();
      paIVar79 = local_1a0;
    }
    do {
      BZ2_hbMakeCodeLengths(*paUVar84,*paIVar79,uVar64,0x11);
      uVar82 = uVar82 - 1;
      paIVar79 = paIVar79 + 1;
      paUVar84 = paUVar84 + 1;
    } while (uVar82 != 0);
    uVar85 = (int)local_180 + 1;
    local_180 = (ulong)uVar85;
  } while (uVar85 != 4);
  iVar71 = (int)local_1e0;
  if (0x4652 < iVar71) {
    BZ2_bz__AssertH__fail(0xbbb);
  }
  uVar82 = 0;
  do {
    local_198[uVar82] = (UChar)uVar82;
    uVar82 = uVar82 + 1;
  } while (uVar88 != uVar82);
  if (0 < iVar71) {
    uVar82 = 0;
    do {
      UVar80 = s->selector[uVar82];
      lVar67 = 0;
      while (UVar80 != local_198[0]) {
        UVar4 = local_198[lVar67 + 1];
        local_198[lVar67 + 1] = local_198[0];
        lVar67 = lVar67 + 1;
        local_198[0] = UVar4;
      }
      s->selectorMtf[uVar82] = (UChar)lVar67;
      uVar82 = uVar82 + 1;
    } while (uVar82 != (local_1e0 & 0xffffffff));
  }
  uVar82 = 0;
  paUVar84 = paUVar1;
  local_178 = local_1e0 & 0xffffffff;
  do {
    uVar74 = 0x20;
    uVar85 = 0;
    if (-2 < iVar63) {
      sVar76 = 0;
      uVar85 = 0;
      do {
        uVar73 = (uint)(*paUVar84)[sVar76];
        if (uVar85 <= (*paUVar84)[sVar76]) {
          uVar85 = uVar73;
        }
        if (uVar73 <= uVar74) {
          uVar74 = uVar73;
        }
        sVar76 = sVar76 + 1;
      } while (__n != sVar76);
    }
    if (0x11 < uVar85) {
      BZ2_bz__AssertH__fail(0xbbc);
    }
    if (uVar74 == 0) {
      BZ2_bz__AssertH__fail(0xbbd);
    }
    BZ2_hbAssignCodes(s->code[uVar82],paUVar1[uVar82],uVar74,uVar85,uVar64);
    uVar81 = local_178;
    uVar82 = uVar82 + 1;
    paUVar84 = paUVar84 + 1;
  } while (uVar82 != uVar88);
  lVar67 = 0;
  pBVar77 = local_168;
  do {
    local_198[lVar67] = '\0';
    lVar68 = 0;
    do {
      if (pBVar77[lVar68] != '\0') {
        local_198[lVar67] = '\x01';
      }
      lVar68 = lVar68 + 1;
    } while (lVar68 != 0x10);
    lVar67 = lVar67 + 1;
    pBVar77 = pBVar77 + 0x10;
  } while (lVar67 != 0x10);
  iVar66 = s->numZ;
  lVar67 = 0;
  do {
    iVar65 = s->bsLive;
    if (local_198[lVar67] == '\0') {
      if (7 < iVar65) {
        do {
          s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
          s->numZ = s->numZ + 1;
          s->bsBuff = s->bsBuff << 8;
          iVar57 = s->bsLive;
          iVar65 = iVar57 + -8;
          s->bsLive = iVar65;
        } while (0xf < iVar57);
      }
    }
    else {
      if (7 < iVar65) {
        do {
          s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
          s->numZ = s->numZ + 1;
          s->bsBuff = s->bsBuff << 8;
          iVar57 = s->bsLive;
          iVar65 = iVar57 + -8;
          s->bsLive = iVar65;
        } while (0xf < iVar57);
      }
      s->bsBuff = s->bsBuff | 0x80000000U >> ((byte)iVar65 & 0x1f);
    }
    s->bsLive = iVar65 + 1;
    lVar67 = lVar67 + 1;
  } while (lVar67 != 0x10);
  lVar67 = 0;
  do {
    if (local_198[lVar67] != '\0') {
      lVar68 = 0;
      do {
        iVar65 = s->bsLive;
        if (s->inUse[lVar68 + lVar67 * 0x10] == '\0') {
          if (7 < iVar65) {
            do {
              s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
              s->numZ = s->numZ + 1;
              s->bsBuff = s->bsBuff << 8;
              iVar57 = s->bsLive;
              iVar65 = iVar57 + -8;
              s->bsLive = iVar65;
            } while (0xf < iVar57);
          }
        }
        else {
          if (7 < iVar65) {
            do {
              s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
              s->numZ = s->numZ + 1;
              s->bsBuff = s->bsBuff << 8;
              iVar57 = s->bsLive;
              iVar65 = iVar57 + -8;
              s->bsLive = iVar65;
            } while (0xf < iVar57);
          }
          s->bsBuff = s->bsBuff | 0x80000000U >> ((byte)iVar65 & 0x1f);
        }
        s->bsLive = iVar65 + 1;
        lVar68 = lVar68 + 1;
      } while (lVar68 != 0x10);
    }
    lVar67 = lVar67 + 1;
  } while (lVar67 != 0x10);
  if (2 < s->verbosity) {
    fprintf(_stderr,"      bytes: mapping %d, ",(ulong)(uint)(s->numZ - iVar66));
  }
  iVar65 = s->numZ;
  iVar66 = s->bsLive;
  if (7 < iVar66) {
    do {
      s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
      s->numZ = s->numZ + 1;
      s->bsBuff = s->bsBuff << 8;
      iVar57 = s->bsLive;
      iVar66 = iVar57 + -8;
      s->bsLive = iVar66;
    } while (0xf < iVar57);
  }
  s->bsBuff = s->bsBuff | uVar72 << (0x1dU - (char)iVar66 & 0x1f);
  iVar66 = iVar66 + 3;
  s->bsLive = iVar66;
  if (7 < iVar66) {
    do {
      s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
      s->numZ = s->numZ + 1;
      s->bsBuff = s->bsBuff << 8;
      iVar57 = s->bsLive;
      iVar66 = iVar57 + -8;
      s->bsLive = iVar66;
    } while (0xf < iVar57);
  }
  s->bsBuff = s->bsBuff | iVar71 << (0x11U - (char)iVar66 & 0x1f);
  s->bsLive = iVar66 + 0xf;
  if (0 < iVar71) {
    uVar82 = 0;
    do {
      if (s->selectorMtf[uVar82] != '\0') {
        uVar64 = 0;
        do {
          iVar66 = s->bsLive;
          if (7 < iVar66) {
            do {
              s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
              s->numZ = s->numZ + 1;
              s->bsBuff = s->bsBuff << 8;
              iVar57 = s->bsLive;
              iVar66 = iVar57 + -8;
              s->bsLive = iVar66;
            } while (0xf < iVar57);
          }
          s->bsBuff = s->bsBuff | 0x80000000U >> ((byte)iVar66 & 0x1f);
          s->bsLive = iVar66 + 1;
          uVar64 = uVar64 + 1;
        } while (uVar64 < s->selectorMtf[uVar82]);
      }
      iVar66 = s->bsLive;
      if (7 < iVar66) {
        do {
          s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
          s->numZ = s->numZ + 1;
          s->bsBuff = s->bsBuff << 8;
          iVar57 = s->bsLive;
          iVar66 = iVar57 + -8;
          s->bsLive = iVar66;
        } while (0xf < iVar57);
      }
      s->bsLive = iVar66 + 1;
      uVar82 = uVar82 + 1;
    } while (uVar82 != uVar81);
  }
  if (2 < s->verbosity) {
    fprintf(_stderr,"selectors %d, ",(ulong)(uint)(s->numZ - iVar65));
  }
  iVar66 = s->numZ;
  uVar82 = 0;
  do {
    bVar5 = paUVar1[uVar82][0];
    uVar64 = (uint)bVar5;
    iVar65 = s->bsLive;
    if (7 < iVar65) {
      do {
        s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
        s->numZ = s->numZ + 1;
        s->bsBuff = s->bsBuff << 8;
        iVar57 = s->bsLive;
        iVar65 = iVar57 + -8;
        s->bsLive = iVar65;
      } while (0xf < iVar57);
    }
    s->bsBuff = s->bsBuff | (uint)bVar5 << (0x1bU - (char)iVar65 & 0x1f);
    s->bsLive = iVar65 + 5;
    if (-2 < iVar63) {
      sVar76 = 0;
      do {
        bVar5 = paUVar1[uVar82][sVar76];
        for (; (int)uVar64 < (int)(uint)bVar5; uVar64 = uVar64 + 1) {
          iVar65 = s->bsLive;
          if (7 < iVar65) {
            do {
              s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
              s->numZ = s->numZ + 1;
              s->bsBuff = s->bsBuff << 8;
              iVar57 = s->bsLive;
              iVar65 = iVar57 + -8;
              s->bsLive = iVar65;
            } while (0xf < iVar57);
          }
          s->bsBuff = s->bsBuff | 2 << (0x1eU - (char)iVar65 & 0x1f);
          s->bsLive = iVar65 + 2;
          bVar5 = paUVar1[uVar82][sVar76];
        }
        for (; (int)(uint)paUVar1[uVar82][sVar76] < (int)uVar64; uVar64 = uVar64 - 1) {
          iVar65 = s->bsLive;
          if (7 < iVar65) {
            do {
              s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
              s->numZ = s->numZ + 1;
              s->bsBuff = s->bsBuff << 8;
              iVar57 = s->bsLive;
              iVar65 = iVar57 + -8;
              s->bsLive = iVar65;
            } while (0xf < iVar57);
          }
          s->bsBuff = s->bsBuff | 3 << (0x1eU - (char)iVar65 & 0x1f);
          s->bsLive = iVar65 + 2;
        }
        iVar65 = s->bsLive;
        if (7 < iVar65) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar57 = s->bsLive;
            iVar65 = iVar57 + -8;
            s->bsLive = iVar65;
          } while (0xf < iVar57);
        }
        s->bsLive = iVar65 + 1;
        sVar76 = sVar76 + 1;
      } while (sVar76 != __n);
    }
    uVar82 = uVar82 + 1;
  } while (uVar82 != uVar88);
  if (2 < s->verbosity) {
    fprintf(_stderr,"code lengths %d, ",(ulong)(uint)(s->numZ - iVar66));
  }
  iVar63 = s->numZ;
  iVar66 = s->nMTF;
  lVar67 = 0;
  if (0 < iVar66) {
    iVar65 = 0;
    do {
      iVar57 = iVar66 + -1;
      if (iVar65 + 0x31 < iVar66) {
        iVar57 = iVar65 + 0x31;
      }
      if (uVar72 <= s->selector[lVar67]) {
        BZ2_bz__AssertH__fail(0xbbe);
      }
      if ((bool)(bVar61 & iVar57 - iVar65 == 0x31)) {
        bVar5 = s->selector[lVar67];
        uVar81 = (ulong)bVar5;
        lVar68 = (ulong)bVar5 * 0x100 + uVar81 * 2;
        uVar82 = (ulong)bVar5;
        bVar5 = (*paUVar1)[(ulong)pUVar60[iVar65] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[iVar65]];
        iVar66 = s->bsLive;
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 1] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 1]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 2] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 2]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 3] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 3]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 4] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 4]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 5] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 5]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 6] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 6]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 7] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 7]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 8] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 8]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 9] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 9]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 10] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 10]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0xb] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0xb]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0xc] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0xc]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0xd] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0xd]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0xe] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0xe]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0xf] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0xf]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x10] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x10]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x11] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x11]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x12] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x12]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x13] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x13]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x14] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x14]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x15] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x15]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x16] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x16]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x17] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x17]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x18] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x18]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x19] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x19]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x1a] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x1a]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x1b] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x1b]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x1c] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x1c]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x1d] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x1d]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x1e] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x1e]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x1f] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x1f]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x20] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x20]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x21] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x21]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x22] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x22]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x23] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x23]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x24] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x24]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x25] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x25]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x26] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x26]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x27] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x27]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x28] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x28]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x29] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x29]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x2a] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x2a]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x2b] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x2b]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x2c] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x2c]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x2d] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x2d]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x2e] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x2e]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x2f] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x2f]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x30] + lVar68];
        iVar58 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x30]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar59 = s->bsLive;
            iVar66 = iVar59 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar59);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar58 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
        bVar5 = (*paUVar1)[(ulong)pUVar60[(long)iVar65 + 0x31] + lVar68];
        iVar65 = s->code[0][uVar81 * 2 + uVar82 * 0x100 + (ulong)pUVar60[(long)iVar65 + 0x31]];
        if (7 < iVar66) {
          do {
            s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
            s->numZ = s->numZ + 1;
            s->bsBuff = s->bsBuff << 8;
            iVar58 = s->bsLive;
            iVar66 = iVar58 + -8;
            s->bsLive = iVar66;
          } while (0xf < iVar58);
        }
        iVar66 = iVar66 + (uint)bVar5;
        s->bsBuff = s->bsBuff | iVar65 << (-(char)iVar66 & 0x1fU);
        s->bsLive = iVar66;
      }
      else if (iVar65 <= iVar57) {
        lVar68 = (long)iVar65;
        do {
          bVar5 = s->selector[lVar67];
          bVar6 = (*paUVar1)[(ulong)pUVar60[lVar68] + (ulong)bVar5 * 0x100 + (ulong)bVar5 * 2];
          iVar65 = s->code[0][(ulong)bVar5 * 2 + (ulong)bVar5 * 0x100 + (ulong)pUVar60[lVar68]];
          iVar66 = s->bsLive;
          if (7 < iVar66) {
            do {
              s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
              s->numZ = s->numZ + 1;
              s->bsBuff = s->bsBuff << 8;
              iVar58 = s->bsLive;
              iVar66 = iVar58 + -8;
              s->bsLive = iVar66;
            } while (0xf < iVar58);
          }
          iVar66 = iVar66 + (uint)bVar6;
          s->bsBuff = s->bsBuff | iVar65 << (-(char)iVar66 & 0x1fU);
          s->bsLive = iVar66;
          lVar68 = lVar68 + 1;
        } while (iVar57 + 1 != (int)lVar68);
      }
      iVar65 = iVar57 + 1;
      lVar67 = lVar67 + 1;
      iVar66 = s->nMTF;
    } while (iVar65 < iVar66);
  }
  if ((int)lVar67 != iVar71) {
    BZ2_bz__AssertH__fail(0xbbf);
  }
  is_last_block = (Bool)local_16c;
  if (2 < s->verbosity) {
    fprintf(_stderr,"codes %d\n",(ulong)(uint)(s->numZ - iVar63));
  }
LAB_0012a061:
  if (is_last_block != '\0') {
    bsPutUChar(s,'\x17');
    bsPutUChar(s,'r');
    bsPutUChar(s,'E');
    bsPutUChar(s,'8');
    bsPutUChar(s,'P');
    bsPutUChar(s,0x90);
    bsPutUInt32(s,s->combinedCRC);
    if (1 < s->verbosity) {
      BZ2_compressBlock_cold_2();
    }
    if (0 < s->bsLive) {
      do {
        s->zbits[s->numZ] = *(UChar *)((long)&s->bsBuff + 3);
        s->numZ = s->numZ + 1;
        s->bsBuff = s->bsBuff << 8;
        iVar63 = s->bsLive;
        s->bsLive = iVar63 + -8;
      } while (8 < iVar63);
    }
  }
  return;
}

Assistant:

void BZ2_compressBlock ( EState* s, Bool is_last_block )
{
   if (s->nblock > 0) {

      BZ_FINALISE_CRC ( s->blockCRC );
      s->combinedCRC = (s->combinedCRC << 1) | (s->combinedCRC >> 31);
      s->combinedCRC ^= s->blockCRC;
      if (s->blockNo > 1) s->numZ = 0;

      if (s->verbosity >= 2)
         VPrintf4( "    block %d: crc = 0x%08x, "
                   "combined CRC = 0x%08x, size = %d\n",
                   s->blockNo, s->blockCRC, s->combinedCRC, s->nblock );

      BZ2_blockSort ( s );
   }

   s->zbits = (UChar*) (&((UChar*)s->arr2)[s->nblock]);

   /*-- If this is the first block, create the stream header. --*/
   if (s->blockNo == 1) {
      BZ2_bsInitWrite ( s );
      bsPutUChar ( s, BZ_HDR_B );
      bsPutUChar ( s, BZ_HDR_Z );
      bsPutUChar ( s, BZ_HDR_h );
      bsPutUChar ( s, (UChar)(BZ_HDR_0 + s->blockSize100k) );
   }

   if (s->nblock > 0) {

      bsPutUChar ( s, 0x31 ); bsPutUChar ( s, 0x41 );
      bsPutUChar ( s, 0x59 ); bsPutUChar ( s, 0x26 );
      bsPutUChar ( s, 0x53 ); bsPutUChar ( s, 0x59 );

      /*-- Now the block's CRC, so it is in a known place. --*/
      bsPutUInt32 ( s, s->blockCRC );

      /*-- 
         Now a single bit indicating (non-)randomisation. 
         As of version 0.9.5, we use a better sorting algorithm
         which makes randomisation unnecessary.  So always set
         the randomised bit to 'no'.  Of course, the decoder
         still needs to be able to handle randomised blocks
         so as to maintain backwards compatibility with
         older versions of bzip2.
      --*/
      bsW(s,1,0);

      bsW ( s, 24, s->origPtr );
      generateMTFValues ( s );
      sendMTFValues ( s );
   }


   /*-- If this is the last block, add the stream trailer. --*/
   if (is_last_block) {

      bsPutUChar ( s, 0x17 ); bsPutUChar ( s, 0x72 );
      bsPutUChar ( s, 0x45 ); bsPutUChar ( s, 0x38 );
      bsPutUChar ( s, 0x50 ); bsPutUChar ( s, 0x90 );
      bsPutUInt32 ( s, s->combinedCRC );
      if (s->verbosity >= 2)
         VPrintf1( "    final combined CRC = 0x%08x\n   ", s->combinedCRC );
      bsFinishWrite ( s );
   }
}